

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O2

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,char (*value) [25])

{
  string sStack_38;
  
  PrintToString<char[25]>(&sStack_38,value);
  std::operator<<((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(string *)&sStack_38
                 );
  std::__cxx11::string::~string((string *)&sStack_38);
  return this;
}

Assistant:

iuStreamMessage& operator << (const T(&value)[SIZE])
    {
        m_stream << PrintToString(value);
        return *this;
    }